

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O2

void __thiscall
HvFile::enumfileentries(HvFile *this,function<void_(std::shared_ptr<ent::base>)> *cb)

{
  uint32_t startofs;
  pointer puVar1;
  int iVar2;
  uint uVar3;
  function<void_(std::shared_ptr<ent::base>)> local_50;
  
  uVar3 = 0;
  while( true ) {
    puVar1 = (this->_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->_offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2) - 1U <= (ulong)uVar3)
    break;
    startofs = puVar1[uVar3];
    iVar2 = (*((this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_ReadWriter[6])();
    std::function<void_(std::shared_ptr<ent::base>)>::function(&local_50,cb);
    enumsectionentries(this,startofs,iVar2 - 0x5000,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void enumfileentries(std::function<void(ent::entry_ptr)> cb)
    {
        for (unsigned i=0 ; i<_offsets.size()-1 ; i++)
            enumsectionentries(_offsets[i], _r->size()-0x5000, cb);
    }